

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall
cmCursesMainForm::Render(cmCursesMainForm *this,int left,int top,int width,int height)

{
  cmState *pcVar1;
  bool bVar2;
  cmCursesStringWidget *sw;
  FIELD *field;
  void *pvVar3;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar4;
  char *pcVar5;
  char *pcVar6;
  FORM *pFVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  pointer ppcVar11;
  undefined4 in_register_00000034;
  allocator local_8e;
  allocator local_8d;
  int local_8c;
  int local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  undefined8 local_78;
  string local_70;
  string local_50;
  
  local_78 = CONCAT44(in_register_00000034,left);
  pFVar7 = (this->super_cmCursesForm).Form;
  local_8c = height;
  local_7c = top;
  if (pFVar7 != (FORM *)0x0) {
    field = current_field(pFVar7);
    pvVar3 = field_userptr(field);
    if (*(int *)((long)pvVar3 + 8) - 1U < 3) {
      *(undefined1 *)((long)pvVar3 + 0x3c) = 0;
    }
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (((0x40 < width) && (5 < local_8c)) && (this->InitialWidth <= width)) {
    if (this->AdvancedMode == true) {
      pvVar4 = this->Entries;
      this->NumberOfVisibleEntries =
           (long)(pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    else {
      this->NumberOfVisibleEntries = 0;
      pvVar4 = this->Entries;
      for (ppcVar11 = (pvVar4->
                      super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppcVar11 !=
          (pvVar4->
          super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
          )._M_impl.super__Vector_impl_data._M_finish; ppcVar11 = ppcVar11 + 1) {
        pcVar1 = this->CMakeInstance->State;
        pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar11);
        std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
        pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pcVar1 = this->CMakeInstance->State;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar11);
        std::__cxx11::string::string((string *)&local_70,pcVar6,&local_8d);
        std::__cxx11::string::string((string *)&local_50,"ADVANCED",&local_8e);
        bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        pvVar4 = this->Entries;
      }
    }
    this->NumberOfPages = 1;
    if (7 < local_8c) {
      local_8c = local_8c + -7;
      ppcVar11 = (pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_80 = (int)local_78 + 0x20;
      local_84 = (int)local_78 + 0x21;
      local_88 = 0;
      for (; ppcVar11 !=
             (pvVar4->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish; ppcVar11 = ppcVar11 + 1) {
        pcVar1 = this->CMakeInstance->State;
        pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar11);
        std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
        pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pcVar1 = this->CMakeInstance->State;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar11);
        std::__cxx11::string::string((string *)&local_70,pcVar6,&local_8d);
        std::__cxx11::string::string((string *)&local_50,"ADVANCED",&local_8e);
        bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
          iVar8 = local_88 % local_8c;
          bVar2 = 0 < local_88 / local_8c;
          if (iVar8 == 0 && bVar2) {
            this->NumberOfPages = this->NumberOfPages + 1;
          }
          uVar10 = iVar8 + local_7c;
          (*((*ppcVar11)->Label->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar11)->Label,local_78,(ulong)uVar10,(ulong)(iVar8 == 0 && bVar2));
          (*((*ppcVar11)->IsNewLabel->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar11)->IsNewLabel,(ulong)local_80,(ulong)uVar10,0);
          (*(*ppcVar11)->Entry->_vptr_cmCursesWidget[3])
                    ((*ppcVar11)->Entry,(ulong)local_84,(ulong)uVar10,0);
          (*ppcVar11)->Entry->Page = this->NumberOfPages;
          local_88 = local_88 + 1;
        }
        pvVar4 = this->Entries;
      }
    }
    pFVar7 = new_form(this->Fields);
    (this->super_cmCursesForm).Form = pFVar7;
    post_form(pFVar7);
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    if (_stdscr == 0) {
      uVar9 = 0xffffffffffffffff;
    }
    else {
      uVar9 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
    }
    wtouchln(_stdscr,0,uVar9,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::Render(int left, int top, int width, int height)
{

  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cmCursesWidget* cw =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    // If in edit mode, get out of it
    if (cw->GetType() == cmStateEnums::STRING ||
        cw->GetType() == cmStateEnums::PATH ||
        cw->GetType() == cmStateEnums::FILEPATH) {
      cmCursesStringWidget* sw = static_cast<cmCursesStringWidget*>(cw);
      sw->SetInEdit(false);
    }
    // Delete the previous form
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = CM_NULLPTR;
  }

  // Wrong window size
  if (width < cmCursesMainForm::MIN_WIDTH || width < this->InitialWidth ||
      height < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Leave room for toolbar
  height -= 7;

  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries->size();
  } else {
    // If normal, display only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
      const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          (*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }

  // Re-adjust the fields according to their place
  this->NumberOfPages = 1;
  if (height > 0) {
    bool isNewPage;
    int i = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
      const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          (*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      int row = (i % height) + 1;
      int page = (i / height) + 1;
      isNewPage = (page > 1) && (row == 1);

      if (isNewPage) {
        this->NumberOfPages++;
      }
      (*it)->Label->Move(left, top + row - 1, isNewPage);
      (*it)->IsNewLabel->Move(left + 32, top + row - 1, false);
      (*it)->Entry->Move(left + 33, top + row - 1, false);
      (*it)->Entry->SetPage(this->NumberOfPages);
      i++;
    }
  }

  // Post the form
  this->Form = new_form(this->Fields);
  post_form(this->Form);
  // Update toolbar
  this->UpdateStatusBar();
  this->PrintKeys();

  touchwin(stdscr);
  refresh();
}